

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::RunBullseyeCoverageBranch
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *coveredFileNames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *filesFullPath)

{
  char **ppcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  long *plVar9;
  iterator iVar10;
  uint logFileCount;
  pointer __k;
  undefined **content;
  int line;
  string outputFile;
  string file;
  string lineIn;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileMap;
  ostringstream cmCTestLog_msg_4;
  cmXMLWriter covLogXML;
  ifstream fin;
  cmGeneratedFileStream covLogFile;
  int local_740;
  int local_73c;
  ulong local_738;
  long *local_730;
  long local_720 [2];
  string local_710;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6f0;
  key_type local_6e8;
  string local_6c8;
  _Base_ptr local_6a8;
  char *local_6a0;
  _Rb_tree_node_base local_698;
  size_t local_678;
  undefined1 local_670 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660 [6];
  ios_base local_600 [264];
  cmXMLWriter local_4f8;
  undefined1 local_4a0 [16];
  _func_int *local_490 [2];
  byte abStack_480 [80];
  ios_base local_430 [408];
  undefined1 local_298 [616];
  
  local_6f0 = &coveredFileNames->_M_t;
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(filesFullPath->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(filesFullPath->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
    cmXMLWriter::cmXMLWriter(&local_4f8,(ostream *)local_298,0);
    bVar3 = StartCoverageLogFile(this,(cmGeneratedFileStream *)local_298,0);
    iVar5 = -1;
    if (bVar3) {
      StartCoverageLogXML(this,&local_4f8);
      local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
      local_710._M_string_length = 0;
      local_710.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a0,"run covbr: ",0xb);
      std::ios::widen((char)(ostream *)local_4a0 + (char)*(_func_int **)(local_4a0._0_8_ + -0x18));
      std::ostream::put((char)local_4a0);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x6d3,(char *)local_670._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
        operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
      std::ios_base::~ios_base(local_430);
      iVar5 = RunBullseyeCommand(this,cont,"covbr",(char *)0x0,&local_710);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a0,"error running covbr for.",0x18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a0,"\n",1);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x6d8,(char *)local_670._0_8_,false);
        if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
          operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
        std::ios_base::~ios_base(local_430);
        iVar5 = -1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a0,"covbr output in  ",0x11);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_4a0,local_710._M_dataplus._M_p,
                            local_710._M_string_length);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x6dd,(char *)local_670._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
          operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
        std::ios_base::~ios_base(local_430);
        std::ifstream::ifstream(local_4a0,local_710._M_dataplus._M_p,_S_in);
        if ((abStack_480[(long)*(_func_int **)(local_4a0._0_8_ + -0x18)] & 5) == 0) {
          local_698._M_left = &local_698;
          local_698._M_color = _S_red;
          local_698._M_parent = (_Base_ptr)0x0;
          local_678 = 0;
          __k = (files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
          local_698._M_right = local_698._M_left;
          if (__k != (files->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
            do {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_6a0,__k);
              std::__cxx11::string::_M_assign((string *)pmVar7);
              __k = __k + 1;
            } while (__k != (files->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish);
          }
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          local_6c8._M_string_length = 0;
          local_6c8.field_2._M_local_buf[0] = '\0';
          local_73c = 0;
          local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
          local_6e8._M_string_length = 0;
          local_738 = 0;
          local_6e8.field_2._M_local_buf[0] = '\0';
          local_6a8 = &(((_Rep_type *)&local_6f0->_M_impl)->_M_impl).super__Rb_tree_header._M_header
          ;
          local_740 = 0;
          bVar3 = false;
          while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)local_4a0,&local_6c8,(bool *)0x0,0xffffffffffffffff),
                bVar4) {
            if ((local_6c8._M_string_length < 2) ||
               (local_6c8._M_dataplus._M_p[local_6c8._M_string_length - 1] != ':')) {
LAB_001f2c60:
              if (bVar3) {
                local_670._0_8_ = local_670 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"Line","");
                cmXMLWriter::StartElement(&local_4f8,(string *)local_670);
                if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                  operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
                }
                cmXMLWriter::Attribute<int>(&local_4f8,"Number",&local_73c);
                local_670._0_4_ = 0xffffffff;
                cmXMLWriter::Attribute<int>(&local_4f8,"Count",(int *)local_670);
                cmXMLWriter::Content<std::__cxx11::string>(&local_4f8,&local_6c8);
                cmXMLWriter::EndElement(&local_4f8);
                local_73c = local_73c + 1;
              }
            }
            else {
              std::__cxx11::string::substr((ulong)local_670,(ulong)&local_6c8);
              std::__cxx11::string::operator=((string *)&local_6e8,(string *)local_670);
              if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
              }
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(local_6f0,&local_6e8);
              if (iVar8._M_node == local_6a8) goto LAB_001f2c60;
              if (bVar3) {
                cmXMLWriter::EndElement(&local_4f8);
                cmXMLWriter::EndElement(&local_4f8);
              }
              if (local_740 == 0) {
                local_740 = 0;
              }
              else if ((local_740 * -0x3d70a3d7 + 0x51eb850U >> 2 | local_740 * 0x40000000) <
                       0x28f5c29) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_670,"start a new log file: ",0x16);
                plVar9 = (long *)std::ostream::operator<<((string *)local_670,local_740);
                std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                std::ostream::put((char)plVar9);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x703,(char *)local_730,(this->super_cmCTestGenericHandler).Quiet);
                if (local_730 != local_720) {
                  operator_delete(local_730,local_720[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
                std::ios_base::~ios_base(local_600);
                EndCoverageLogXML(this,&local_4f8);
                EndCoverageLogFile(this,(cmGeneratedFileStream *)local_298,(int)local_738);
                logFileCount = (int)local_738 + 1;
                local_738 = (ulong)logFileCount;
                bVar3 = StartCoverageLogFile(this,(cmGeneratedFileStream *)local_298,logFileCount);
                if (!bVar3) {
                  iVar5 = -1;
                  goto LAB_001f3054;
                }
                StartCoverageLogXML(this,&local_4f8);
                local_740 = local_740 + 1;
              }
              iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_6a0,&local_6e8);
              bVar3 = false;
              if (iVar10._M_node != &local_698) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_670,"Produce coverage for file: ",0x1b);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_670,local_6e8._M_dataplus._M_p,
                                    local_6e8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                local_740 = local_740 + 1;
                plVar9 = (long *)std::ostream::operator<<(poVar6,local_740);
                std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                std::ostream::put((char)plVar9);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x715,(char *)local_730,(this->super_cmCTestGenericHandler).Quiet);
                if (local_730 != local_720) {
                  operator_delete(local_730,local_720[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
                std::ios_base::~ios_base(local_600);
                local_670._0_8_ = local_670 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"File","");
                cmXMLWriter::StartElement(&local_4f8,(string *)local_670);
                if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                  operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
                }
                cmXMLWriter::Attribute<std::__cxx11::string>
                          (&local_4f8,"Name",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (iVar10._M_node + 1));
                cmCTest::GetShortPathToFile
                          ((string *)local_670,(this->super_cmCTestGenericHandler).CTest,
                           (string *)(iVar10._M_node + 2));
                cmXMLWriter::Attribute<std::__cxx11::string>
                          (&local_4f8,"FullPath",(string *)local_670);
                if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                  operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
                }
                local_670._0_8_ = local_670 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"Report","");
                cmXMLWriter::StartElement(&local_4f8,(string *)local_670);
                if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                  operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1);
                }
                local_73c = 0;
                bVar3 = true;
                if ((anonymous_namespace)::bullseyeHelp != (undefined *)0x0) {
                  content = &(anonymous_namespace)::bullseyeHelp;
                  do {
                    local_670._0_8_ = local_670 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"Line","");
                    cmXMLWriter::StartElement(&local_4f8,(string *)local_670);
                    if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
                      operator_delete((void *)local_670._0_8_,local_660[0]._M_allocated_capacity + 1
                                     );
                    }
                    cmXMLWriter::Attribute<int>(&local_4f8,"Number",&local_73c);
                    local_670._0_4_ = 0xffffffff;
                    cmXMLWriter::Attribute<int>(&local_4f8,"Count",(int *)local_670);
                    cmXMLWriter::Content<char_const*>(&local_4f8,content);
                    cmXMLWriter::EndElement(&local_4f8);
                    local_73c = local_73c + 1;
                    ppcVar1 = content + 1;
                    content = content + 1;
                  } while (*ppcVar1 != (char *)0x0);
                }
              }
            }
          }
          if (bVar3) {
            cmXMLWriter::EndElement(&local_4f8);
            cmXMLWriter::EndElement(&local_4f8);
          }
          EndCoverageLogXML(this,&local_4f8);
          iVar5 = 1;
          EndCoverageLogFile(this,(cmGeneratedFileStream *)local_298,(int)local_738);
LAB_001f3054:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
            operator_delete(local_6e8._M_dataplus._M_p,
                            CONCAT71(local_6e8.field_2._M_allocated_capacity._1_7_,
                                     local_6e8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
            operator_delete(local_6c8._M_dataplus._M_p,
                            CONCAT71(local_6c8.field_2._M_allocated_capacity._1_7_,
                                     local_6c8.field_2._M_local_buf[0]) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_6a0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_670,"Cannot open coverage file: ",0x1b);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_670,local_710._M_dataplus._M_p,
                              local_710._M_string_length);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x6e2,local_6a0,false);
          if ((_Base_ptr *)local_6a0 != &local_698._M_parent) {
            operator_delete(local_6a0,(ulong)((long)&(local_698._M_parent)->_M_color + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
          std::ios_base::~ios_base(local_600);
          iVar5 = 0;
        }
        std::ifstream::~ifstream(local_4a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_dataplus._M_p != &local_710.field_2) {
        operator_delete(local_710._M_dataplus._M_p,
                        CONCAT71(local_710.field_2._M_allocated_capacity._1_7_,
                                 local_710.field_2._M_local_buf[0]) + 1);
      }
    }
    cmXMLWriter::~cmXMLWriter(&local_4f8);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"Files and full path files not the same size?:\n",0x2e);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x6c4,(char *)local_4a0._0_8_,false);
    if ((_func_int **)local_4a0._0_8_ != local_490) {
      operator_delete((void *)local_4a0._0_8_,(ulong)(local_490[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCoverageBranch(
  cmCTestCoverageHandlerContainer* cont,
  std::set<std::string>& coveredFileNames, std::vector<std::string>& files,
  std::vector<std::string>& filesFullPath)
{
  if (files.size() != filesFullPath.size()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Files and full path files not the same size?:\n");
    return 0;
  }
  // create the output stream for the CoverageLog-N.xml file
  cmGeneratedFileStream covLogFile;
  cmXMLWriter covLogXML(covLogFile);
  int logFileCount = 0;
  if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
    return -1;
  }
  this->StartCoverageLogXML(covLogXML);
  // for each file run covbr on that file to get the coverage
  // information for that file
  std::string outputFile;
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "run covbr: " << std::endl, this->Quiet);

  if (!this->RunBullseyeCommand(cont, "covbr", nullptr, outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error running covbr for."
                 << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "covbr output in  " << outputFile << std::endl,
                     this->Quiet);
  // open the output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage file: " << outputFile << std::endl);
    return 0;
  }
  std::map<std::string, std::string> fileMap;
  auto fp = filesFullPath.begin();
  for (auto f = files.begin(); f != files.end(); ++f, ++fp) {
    fileMap[*f] = *fp;
  }

  int count = 0; // keep count of the number of files
  // Now parse each line from the bullseye cov log file
  std::string lineIn;
  bool valid = false; // are we in a valid output file
  int line = 0;       // line of the current file
  std::string file;
  while (cmSystemTools::GetLineFromStream(fin, lineIn)) {
    bool startFile = false;
    if (lineIn.size() > 1 && lineIn[lineIn.size() - 1] == ':') {
      file = lineIn.substr(0, lineIn.size() - 1);
      if (coveredFileNames.find(file) != coveredFileNames.end()) {
        startFile = true;
      }
    }
    if (startFile) {
      // if we are in a valid file close it because a new one started
      if (valid) {
        covLogXML.EndElement(); // Report
        covLogXML.EndElement(); // File
      }
      // only allow 100 files in each log file
      if (count != 0 && count % 100 == 0) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "start a new log file: " << count << std::endl,
                           this->Quiet);
        this->EndCoverageLogXML(covLogXML);
        this->EndCoverageLogFile(covLogFile, logFileCount);
        logFileCount++;
        if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
          return -1;
        }
        this->StartCoverageLogXML(covLogXML);
        count++; // move on one
      }
      auto i = fileMap.find(file);
      // if the file should be covered write out the header for that file
      if (i != fileMap.end()) {
        // we have a new file so count it in the output
        count++;
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Produce coverage for file: " << file << " "
                                                         << count << std::endl,
                           this->Quiet);
        // start the file output
        covLogXML.StartElement("File");
        covLogXML.Attribute("Name", i->first);
        covLogXML.Attribute("FullPath",
                            this->CTest->GetShortPathToFile(i->second));
        covLogXML.StartElement("Report");
        // write the bullseye header
        line = 0;
        for (int k = 0; bullseyeHelp[k] != nullptr; ++k) {
          covLogXML.StartElement("Line");
          covLogXML.Attribute("Number", line);
          covLogXML.Attribute("Count", -1);
          covLogXML.Content(bullseyeHelp[k]);
          covLogXML.EndElement(); // Line
          line++;
        }
        valid = true; // we are in a valid file section
      } else {
        // this is not a file that we want coverage for
        valid = false;
      }
    }
    // we are not at a start file, and we are in a valid file output the line
    else if (valid) {
      covLogXML.StartElement("Line");
      covLogXML.Attribute("Number", line);
      covLogXML.Attribute("Count", -1);
      covLogXML.Content(lineIn);
      covLogXML.EndElement(); // Line
      line++;
    }
  }
  // if we ran out of lines a valid file then close that file
  if (valid) {
    covLogXML.EndElement(); // Report
    covLogXML.EndElement(); // File
  }
  this->EndCoverageLogXML(covLogXML);
  this->EndCoverageLogFile(covLogFile, logFileCount);
  return 1;
}